

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O2

void __thiscall
gvr::TriangleReceiver::setPolygon(TriangleReceiver *this,int instance,PLYValue *value)

{
  Mesh *pMVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ostream *poVar6;
  long lVar7;
  
  pMVar1 = this->p;
  uVar3 = (*value->_vptr_PLYValue[5])(value,0);
  uVar4 = (*value->_vptr_PLYValue[5])(value,1);
  uVar5 = (*value->_vptr_PLYValue[5])(value,2);
  puVar2 = pMVar1->triangle;
  lVar7 = (long)(instance * 3);
  puVar2[lVar7] = uVar3;
  puVar2[lVar7 + 1] = uVar4;
  puVar2[lVar7 + 2] = uVar5;
  poVar6 = std::operator<<((ostream *)&std::cerr,
                           "Warning: Cannot triangulate polygons in PLY file. Please recompile with GLU support."
                          );
  std::endl<char,std::char_traits<char>>(poVar6);
  return;
}

Assistant:

void TriangleReceiver::setPolygon(int instance, const PLYValue &value)
{
  p.setTriangleIndex(instance, value.getUnsignedInt(0), value.getUnsignedInt(1),
    value.getUnsignedInt(2));

  std::cerr << "Warning: Cannot triangulate polygons in PLY file. Please recompile with GLU support." << std::endl;
}